

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int hash_to_curve(secp256k1_ge *ge,uint8_t *pd,size_t len)

{
  int iVar1;
  secp256k1_sha256 sha256_m;
  size_t safety;
  size_t k;
  uint8_t hash [32];
  secp256k1_fe x;
  int in_stack_ffffffffffffff1c;
  secp256k1_fe *in_stack_ffffffffffffff20;
  secp256k1_ge *in_stack_ffffffffffffff28;
  secp256k1_sha256 *in_stack_ffffffffffffff30;
  uchar *in_stack_ffffffffffffff48;
  secp256k1_sha256 *in_stack_ffffffffffffff50;
  secp256k1_ge *a;
  secp256k1_ge *local_70;
  uchar local_68 [32];
  secp256k1_fe local_48;
  uint local_4;
  
  a = (secp256k1_ge *)0x80;
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xffffffffffffff20);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff30,(uchar *)in_stack_ffffffffffffff28,
             (size_t)in_stack_ffffffffffffff20);
  secp256k1_sha256_finalize(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_70 = (secp256k1_ge *)0x0;
  while ((local_70 < a &&
         (((iVar1 = secp256k1_fe_set_b32(&local_48,local_68), iVar1 == 0 ||
           (iVar1 = secp256k1_ge_set_xo_var
                              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff1c), iVar1 == 0)) ||
          (iVar1 = secp256k1_ge_is_valid_var(a), iVar1 == 0))))) {
    secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xffffffffffffff20);
    secp256k1_sha256_write
              (in_stack_ffffffffffffff30,(uchar *)in_stack_ffffffffffffff28,
               (size_t)in_stack_ffffffffffffff20);
    secp256k1_sha256_finalize(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    local_70 = (secp256k1_ge *)((long)(local_70->x).n + 1);
  }
  local_4 = (uint)(local_70 == a);
  return local_4;
}

Assistant:

static int hash_to_curve(secp256k1_ge *ge, const uint8_t *pd, size_t len)
{
    secp256k1_fe x;
    uint8_t hash[32];
    size_t k, safety = 128;
    secp256k1_sha256 sha256_m;

    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_sha256_write(&sha256_m, pd, len);
    secp256k1_sha256_finalize(&sha256_m, hash);

    for (k = 0; k < safety; ++k) {
        if (secp256k1_fe_set_b32(&x, hash)
            && secp256k1_ge_set_xo_var(ge, &x, 0)
            && secp256k1_ge_is_valid_var(ge)) { /* Is secp256k1_ge_is_valid_var necessary? */
            break;
        }

        secp256k1_sha256_initialize(&sha256_m);
        secp256k1_sha256_write(&sha256_m, hash, 32);
        secp256k1_sha256_finalize(&sha256_m, hash);
    }

    if (k == safety) {
        return 1; /* failed */
    }
    return 0;
}